

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O3

time_t RelativeDate(time_t Start,time_t zone,int dstmode,time_t DayOrdinal,time_t DayNumber)

{
  tm *ptVar1;
  time_t tVar2;
  long lVar3;
  time_t t;
  tm_conflict tmbuf;
  time_t in_stack_ffffffffffffff98;
  long local_60;
  tm local_58;
  
  local_60 = Start - zone;
  ptVar1 = gmtime_r(&local_60,&local_58);
  lVar3 = DayNumber - ptVar1->tm_wday;
  tVar2 = (DayOrdinal - (ulong)(0 < DayOrdinal)) * 0x93a80 +
          (lVar3 + ((lVar3 + 7) / 7) * -7 + 7) * 0x15180;
  if (dstmode == 2) {
    tVar2 = DSTcorrect(in_stack_ffffffffffffff98,0x225f71);
  }
  return tVar2;
}

Assistant:

static time_t
RelativeDate(time_t Start, time_t zone, int dstmode,
    time_t DayOrdinal, time_t DayNumber)
{
	struct tm	*tm;
	time_t	t, now;
#if defined(HAVE_GMTIME_R) || defined(HAVE_GMTIME_S)
	struct tm	tmbuf;
#endif

	t = Start - zone;
#if defined(HAVE_GMTIME_S)
	tm = gmtime_s(&tmbuf, &t) ? NULL : &tmbuf;
#elif defined(HAVE_GMTIME_R)
	tm = gmtime_r(&t, &tmbuf);
#else
	tm = gmtime(&t);
#endif
	now = Start;
	now += DAY * ((DayNumber - tm->tm_wday + 7) % 7);
	now += 7 * DAY * (DayOrdinal <= 0 ? DayOrdinal : DayOrdinal - 1);
	if (dstmode == DSTmaybe)
		return DSTcorrect(Start, now);
	return now - Start;
}